

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineOutputFile::~DeepScanLineOutputFile(DeepScanLineOutputFile *this)

{
  OStream *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  Data *this_00;
  Lock local_20;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepScanLineOutputFile_0037ba28;
  local_20._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_20._mutex);
  local_20._locked = true;
  iVar2 = (*this->_data->_streamData->os->_vptr_OStream[3])();
  if (this->_data->lineOffsetsPosition != 0) {
    (*this->_data->_streamData->os->_vptr_OStream[4])();
    anon_unknown_7::writeLineOffsets(this->_data->_streamData->os,&this->_data->lineOffsets);
    pOVar1 = this->_data->_streamData->os;
    (*pOVar1->_vptr_OStream[4])(pOVar1,CONCAT44(extraout_var,iVar2));
  }
  IlmThread_2_5::Lock::~Lock(&local_20);
  this_00 = this->_data;
  if ((this_00->_deleteStream == true) &&
     (pOVar1 = this_00->_streamData->os, pOVar1 != (OStream *)0x0)) {
    (*pOVar1->_vptr_OStream[1])();
    this_00 = this->_data;
  }
  if (this_00->partNumber == -1) {
    operator_delete(this_00->_streamData,0x38);
    this_00 = this->_data;
    if (this_00 == (Data *)0x0) {
      this_00 = (Data *)0x0;
      goto LAB_001561d0;
    }
  }
  Data::~Data(this_00);
LAB_001561d0:
  operator_delete(this_00,0x180);
  GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
  return;
}

Assistant:

DeepScanLineOutputFile::~DeepScanLineOutputFile ()
{
    {
        Lock lock(*_data->_streamData);
        Int64 originalPosition = _data->_streamData->os->tellp();

        if (_data->lineOffsetsPosition > 0)
        {
            try
            {
                _data->_streamData->os->seekp (_data->lineOffsetsPosition);
                writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);

                //
                // Restore the original position.
                //
                _data->_streamData->os->seekp (originalPosition);
            }
            catch (...) //NOSONAR - suppress vulnerability reports from SonarCloud.
            {
                //
                // We cannot safely throw any exceptions from here.
                // This destructor may have been called because the
                // stack is currently being unwound for another
                // exception.
                //
            }
        }
    }

    if (_data->_deleteStream)
        delete _data->_streamData->os;

    //
    // (TODO) we should have a way to tell if the stream data is owned by this file or
    // by a parent multipart file.
    //

    if (_data->partNumber == -1)
        delete _data->_streamData;

    delete _data;
}